

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer
          (basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *this)

{
  ~basic_memory_buffer(this);
  operator_delete(this,0x7f0);
  return;
}

Assistant:

~basic_memory_buffer() FMT_OVERRIDE { deallocate(); }